

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O3

RDL_graph * RDL_initNewGraph_g(uint V,char owns_edges)

{
  RDL_graph *pRVar1;
  uint *__s;
  RDL_edge **ppaRVar2;
  RDL_edge *paRVar3;
  uint **ppuVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pRVar1 = (RDL_graph *)malloc(0x28);
  uVar6 = (ulong)V;
  __s = (uint *)malloc(uVar6 * 4);
  if (V != 0) {
    memset(__s,0,uVar6 * 4);
  }
  pRVar1->V = V;
  pRVar1->E = 0;
  pRVar1->degree = __s;
  ppaRVar2 = (RDL_edge **)malloc(uVar6 * 8);
  if (V != 0) {
    uVar7 = 0;
    do {
      if ((ulong)__s[uVar7] != 0) {
        paRVar3 = (RDL_edge *)malloc((ulong)__s[uVar7] << 3);
        ppaRVar2[uVar7] = paRVar3;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  pRVar1->adjList = ppaRVar2;
  if (owns_edges == '\0') {
    uVar5 = 0;
    ppuVar4 = (uint **)0x0;
  }
  else {
    ppuVar4 = (uint **)malloc(0x200);
    uVar5 = 0x40;
  }
  pRVar1->edgesAlloced = uVar5;
  pRVar1->edges = ppuVar4;
  return pRVar1;
}

Assistant:

RDL_graph *RDL_initNewGraph_g(unsigned V, char owns_edges)
{
  RDL_graph *graph = malloc(sizeof(*graph));
  unsigned *degree;
  unsigned i;
  degree = malloc(V * sizeof(*degree));
  for(i=0; i<V; ++i)
  {
    degree[i] = 0;
  }
  RDL_initGraph(graph,V,degree,owns_edges);

  return graph;
}